

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# turbojpeg.c
# Opt level: O2

int tjDecompressToYUVPlanes
              (tjhandle handle,uchar *jpegBuf,unsigned_long jpegSize,uchar **dstPlanes,int width,
              int *strides,int height,int flags)

{
  j_decompress_ptr cinfo;
  int iVar1;
  int iVar2;
  uint uVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  long lVar9;
  code **ppcVar10;
  JSAMPROW *ppJVar11;
  JSAMPROW __ptr;
  int iVar12;
  long lVar13;
  ulong uVar14;
  ulong uVar15;
  tjinstance *this;
  char *pcVar16;
  ulong uVar17;
  JSAMPROW pJVar18;
  long lVar19;
  uchar *puVar20;
  int iVar21;
  ulong uVar22;
  int iVar23;
  long *in_FS_OFFSET;
  undefined4 uVar24;
  undefined4 uVar25;
  my_progress_mgr progress;
  size_t sStack_2c0;
  int th [10];
  JSAMPROW *tmpbuf [10];
  JSAMPROW *outbuf [10];
  int crow [10];
  int iw [10];
  int ph [10];
  int pw [10];
  JSAMPARRAY yuvptr [10];
  code *local_58;
  undefined8 local_50;
  undefined8 uStack_48;
  undefined8 local_40;
  tjhandle local_38;
  
  if (handle == (tjhandle)0x0) {
    *(undefined8 *)((long)in_FS_OFFSET + -0xc9) = 0x656c646e616820;
    in_FS_OFFSET[-0x1a] = 0x2064696c61766e49;
    return -1;
  }
  *(undefined4 *)((long)handle + 0x5f8) = 0;
  *(undefined4 *)((long)handle + 0x6d0) = 0;
  *(uint *)((long)handle + 0x5fc) = (uint)flags >> 0xd & 1;
  for (lVar9 = 0; lVar9 != 10; lVar9 = lVar9 + 1) {
    tmpbuf[lVar9] = (JSAMPROW *)0x0;
    outbuf[lVar9] = (JSAMPROW *)0x0;
  }
  cinfo = (j_decompress_ptr)((long)handle + 0x208);
  uVar8 = 0xffffffff;
  if ((*(byte *)((long)handle + 0x600) & 2) == 0) {
    memcpy((void *)((long)handle + 0x608),
           "tjDecompressToYUVPlanes(): Instance has not been initialized for decompression",0x4f);
    *(undefined4 *)((long)handle + 0x6d0) = 1;
    memcpy((void *)(*in_FS_OFFSET + -0xd0),
           "tjDecompressToYUVPlanes(): Instance has not been initialized for decompression",0x4f);
    __ptr = (JSAMPROW)0x0;
    goto LAB_0010d31d;
  }
  if (((dstPlanes == (uchar **)0x0 || (jpegSize == 0 || jpegBuf == (uchar *)0x0)) ||
      ((height | width) < 0)) || (*dstPlanes == (uchar *)0x0)) {
    builtin_strncpy((char *)((long)handle + 0x624),"nvalid a",8);
    builtin_strncpy((char *)((long)handle + 0x62c),"rgument",8);
    builtin_strncpy((char *)((long)handle + 0x618),"VPlanes(",8);
    builtin_strncpy((char *)((long)handle + 0x620),"): Inval",8);
    builtin_strncpy((char *)((long)handle + 0x608),"tjDecomp",8);
    builtin_strncpy((char *)((long)handle + 0x610),"ressToYU",8);
    *(undefined4 *)((long)handle + 0x6d0) = 1;
    builtin_strncpy((char *)((long)in_FS_OFFSET + -0xb4),"nvalid a",8);
    builtin_strncpy((char *)((long)in_FS_OFFSET + -0xac),"rgument",8);
    in_FS_OFFSET[-0x18] = 0x2873656e616c5056;
    in_FS_OFFSET[-0x17] = 0x6c61766e49203a29;
    in_FS_OFFSET[-0x1a] = 0x706d6f6365446a74;
    in_FS_OFFSET[-0x19] = 0x55596f5473736572;
    __ptr = (JSAMPROW)0x0;
    goto LAB_0010d31d;
  }
  if ((flags & 8U) == 0) {
    if ((flags & 0x10U) != 0) {
      pcVar16 = "JSIMD_FORCESSE=1";
      goto LAB_0010d398;
    }
    if ((flags & 0x20U) != 0) {
      pcVar16 = "JSIMD_FORCESSE2=1";
      goto LAB_0010d398;
    }
  }
  else {
    pcVar16 = "JSIMD_FORCEMMX=1";
LAB_0010d398:
    putenv(pcVar16);
  }
  if ((short)flags < 0) {
    ppcVar10 = &local_58;
    local_50 = 0;
    uStack_48 = 0;
    local_40 = 0;
    local_58 = my_progress_monitor;
    local_38 = handle;
  }
  else {
    ppcVar10 = (code **)0x0;
  }
  *(code ***)((long)handle + 0x218) = ppcVar10;
  iVar5 = _setjmp((__jmp_buf_tag *)((long)handle + 0x528));
  if (iVar5 != 0) {
LAB_0010d3ee:
    __ptr = (JSAMPROW)0x0;
LAB_0010d3f6:
    uVar8 = 0xffffffff;
    goto LAB_0010d31d;
  }
  if (*(int *)((long)handle + 0x604) == 0) {
    jpeg_mem_src_tj(cinfo,jpegBuf,jpegSize);
    jpeg_read_header(cinfo,1);
  }
  *(undefined4 *)((long)handle + 0x604) = 0;
  iVar5 = getSubsamp(cinfo);
  if (iVar5 < 0) {
    pcVar16 = "tjDecompressToYUVPlanes(): Could not determine subsampling type for JPEG image";
    sStack_2c0 = 0x4f;
  }
  else {
    if ((iVar5 != 3) && ((dstPlanes[1] == (uchar *)0x0 || (dstPlanes[2] == (uchar *)0x0)))) {
      builtin_strncpy((char *)((long)handle + 0x624),"nvalid a",8);
      builtin_strncpy((char *)((long)handle + 0x62c),"rgument",8);
      uVar24._0_1_ = ')';
      uVar24._1_1_ = ':';
      uVar24._2_1_ = ' ';
      uVar24._3_1_ = 'I';
      uVar25._0_1_ = 'n';
      uVar25._1_1_ = 'v';
      uVar25._2_1_ = 'a';
      uVar25._3_1_ = 'l';
      builtin_strncpy((char *)((long)handle + 0x618),"VPla",4);
      builtin_strncpy((char *)((long)handle + 0x61c),"nes(",4);
      builtin_strncpy((char *)((long)handle + 0x620),"): I",4);
      builtin_strncpy((char *)((long)handle + 0x608),"tjDe",4);
      builtin_strncpy((char *)((long)handle + 0x60c),"comp",4);
      builtin_strncpy((char *)((long)handle + 0x610),"ress",4);
      builtin_strncpy((char *)((long)handle + 0x614),"ToYU",4);
      *(undefined4 *)((long)handle + 0x6d0) = 1;
      builtin_strncpy((char *)((long)in_FS_OFFSET + -0xb4),"nvalid a",8);
      builtin_strncpy((char *)((long)in_FS_OFFSET + -0xac),"rgument",8);
      goto LAB_0010d575;
    }
    if (width == 0) {
      width = *(int *)((long)handle + 0x238);
    }
    if (height == 0) {
      height = *(int *)((long)handle + 0x23c);
    }
    for (lVar9 = 0; lVar9 != 0x10; lVar9 = lVar9 + 1) {
      iVar1 = sf[lVar9].denom;
      if (((sf[lVar9].num * *(int *)((long)handle + 0x238) + iVar1 + -1) / iVar1 <= width) &&
         ((sf[lVar9].num * *(int *)((long)handle + 0x23c) + iVar1 + -1) / iVar1 <= height)) {
        if (*(int *)((long)handle + 0x240) < 4) {
          iVar1 = sf[lVar9].num;
          iVar2 = sf[lVar9].denom;
          *(int *)((long)handle + 0x24c) = iVar1;
          *(int *)((long)handle + 0x250) = iVar2;
          jpeg_calc_output_dimensions(cinfo);
          iVar6 = (iVar1 * 8) / iVar2;
          lVar9 = 0;
          iVar12 = 0;
          bVar4 = false;
          goto LAB_0010d5fa;
        }
        pcVar16 = "tjDecompressToYUVPlanes(): JPEG image must have 3 or fewer components";
        sStack_2c0 = 0x46;
        goto LAB_0010d504;
      }
    }
    pcVar16 = "tjDecompressToYUVPlanes(): Could not scale down to desired image dimensions";
    sStack_2c0 = 0x4c;
  }
LAB_0010d504:
  memcpy((void *)((long)handle + 0x608),pcVar16,sStack_2c0);
  *(undefined4 *)((long)handle + 0x6d0) = 1;
  memcpy((void *)(*in_FS_OFFSET + -0xd0),pcVar16,sStack_2c0);
LAB_0010d587:
  __ptr = (JSAMPROW)0x0;
LAB_0010d58c:
  uVar8 = 0xffffffff;
LAB_0010d31d:
  if (200 < *(int *)((long)handle + 0x22c)) {
    jpeg_abort_decompress(cinfo);
  }
  for (lVar9 = 0; lVar9 != 10; lVar9 = lVar9 + 1) {
    free(tmpbuf[lVar9]);
    free(outbuf[lVar9]);
  }
  free(__ptr);
  *(undefined4 *)((long)handle + 0x5fc) = 0;
  return -(uint)(*(int *)((long)handle + 0x5f8) != 0) | uVar8;
LAB_0010d5fa:
  uVar8 = *(uint *)((long)handle + 0x240);
  if ((int)uVar8 <= lVar9) goto LAB_0010d746;
  lVar19 = *(long *)((long)handle + 0x338);
  lVar13 = lVar9 * 0x60;
  iVar23 = *(int *)(lVar19 + 0x1c + lVar13) * iVar6;
  iw[lVar9] = iVar23;
  iVar21 = *(int *)(lVar19 + 0x20 + lVar13);
  iVar7 = tjPlaneWidth((int)lVar9,*(int *)((long)handle + 0x290),iVar5);
  pw[lVar9] = iVar7;
  uVar8 = tjPlaneHeight((int)lVar9,*(int *)((long)handle + 0x294),iVar5);
  if (iVar21 * iVar6 != uVar8 || iVar23 != iVar7) {
    bVar4 = true;
  }
  ph[lVar9] = uVar8;
  iVar21 = *(int *)(lVar19 + 0xc + lVar13) * iVar6;
  th[lVar9] = iVar21;
  ppJVar11 = (JSAMPROW *)malloc((long)(int)uVar8 << 3);
  outbuf[lVar9] = ppJVar11;
  if (ppJVar11 == (JSAMPROW *)0x0) {
    builtin_strncpy((char *)((long)handle + 0x628),"y alloca",8);
    builtin_strncpy((char *)((long)handle + 0x630),"tion fai",8);
    builtin_strncpy((char *)((long)handle + 0x618),"VPlanes(",8);
    builtin_strncpy((char *)((long)handle + 0x620),"): Memor",8);
    builtin_strncpy((char *)((long)handle + 0x608),"tjDecomp",8);
    builtin_strncpy((char *)((long)handle + 0x610),"ressToYU",8);
    *(undefined8 *)((long)handle + 0x635) = 0x6572756c696166;
    *(undefined4 *)((long)handle + 0x6d0) = 1;
    *(undefined8 *)((long)in_FS_OFFSET + -0xa3) = 0x6572756c696166;
    in_FS_OFFSET[-0x16] = 0x61636f6c6c612079;
    in_FS_OFFSET[-0x15] = 0x696166206e6f6974;
    in_FS_OFFSET[-0x18] = 0x2873656e616c5056;
    in_FS_OFFSET[-0x17] = 0x726f6d654d203a29;
    in_FS_OFFSET[-0x1a] = 0x706d6f6365446a74;
    in_FS_OFFSET[-0x19] = 0x55596f5473736572;
    goto LAB_0010d3ee;
  }
  iVar12 = iVar21 * iVar23 + iVar12;
  puVar20 = dstPlanes[lVar9];
  uVar17 = 0;
  if ((int)uVar8 < 1) {
    uVar8 = 0;
  }
  for (; uVar8 != uVar17; uVar17 = uVar17 + 1) {
    ppJVar11[uVar17] = puVar20;
    if ((strides == (int *)0x0) || (iVar21 = strides[lVar9], strides[lVar9] == 0)) {
      iVar21 = iVar7;
    }
    puVar20 = puVar20 + iVar21;
  }
  lVar9 = lVar9 + 1;
  goto LAB_0010d5fa;
LAB_0010d746:
  if (bVar4) {
    __ptr = (JSAMPROW)malloc((long)iVar12);
    if (__ptr == (JSAMPROW)0x0) {
      builtin_strncpy((char *)((long)handle + 0x628),"y alloca",8);
      builtin_strncpy((char *)((long)handle + 0x630),"tion fai",8);
      uVar24._0_1_ = ')';
      uVar24._1_1_ = ':';
      uVar24._2_1_ = ' ';
      uVar24._3_1_ = 'M';
      uVar25._0_1_ = 'e';
      uVar25._1_1_ = 'm';
      uVar25._2_1_ = 'o';
      uVar25._3_1_ = 'r';
      builtin_strncpy((char *)((long)handle + 0x618),"VPla",4);
      builtin_strncpy((char *)((long)handle + 0x61c),"nes(",4);
      builtin_strncpy((char *)((long)handle + 0x620),"): M",4);
      builtin_strncpy((char *)((long)handle + 0x624),"emor",4);
      builtin_strncpy((char *)((long)handle + 0x608),"tjDe",4);
      builtin_strncpy((char *)((long)handle + 0x60c),"comp",4);
      builtin_strncpy((char *)((long)handle + 0x610),"ress",4);
      builtin_strncpy((char *)((long)handle + 0x614),"ToYU",4);
      *(undefined8 *)((long)handle + 0x635) = 0x6572756c696166;
      *(undefined4 *)((long)handle + 0x6d0) = 1;
      *(undefined8 *)((long)in_FS_OFFSET + -0xa3) = 0x6572756c696166;
      in_FS_OFFSET[-0x16] = 0x61636f6c6c612079;
      in_FS_OFFSET[-0x15] = 0x696166206e6f6974;
LAB_0010d575:
      *(undefined4 *)(in_FS_OFFSET + -0x18) = 0x616c5056;
      builtin_strncpy((char *)((long)in_FS_OFFSET + -0xbc),"nes(",4);
      *(undefined4 *)(in_FS_OFFSET + -0x17) = uVar24;
      *(undefined4 *)((long)in_FS_OFFSET + -0xb4) = uVar25;
      *(undefined4 *)(in_FS_OFFSET + -0x1a) = 0x65446a74;
      builtin_strncpy((char *)((long)in_FS_OFFSET + -0xcc),"comp",4);
      *(undefined4 *)(in_FS_OFFSET + -0x19) = 0x73736572;
      builtin_strncpy((char *)((long)in_FS_OFFSET + -0xc4),"ToYU",4);
      goto LAB_0010d587;
    }
    uVar17 = 0;
    if ((int)uVar8 < 1) {
      uVar8 = 0;
    }
    pJVar18 = __ptr;
    for (uVar22 = uVar17; uVar22 != uVar8; uVar22 = uVar22 + 1) {
      uVar3 = th[uVar22];
      ppJVar11 = (JSAMPROW *)malloc((long)(int)uVar3 * 8);
      tmpbuf[uVar22] = ppJVar11;
      if (ppJVar11 == (JSAMPROW *)0x0) {
        builtin_strncpy((char *)((long)handle + 0x628),"y alloca",8);
        builtin_strncpy((char *)((long)handle + 0x630),"tion fai",8);
        builtin_strncpy((char *)((long)handle + 0x618),"VPlanes(",8);
        builtin_strncpy((char *)((long)handle + 0x620),"): Memor",8);
        builtin_strncpy((char *)((long)handle + 0x608),"tjDecomp",8);
        builtin_strncpy((char *)((long)handle + 0x610),"ressToYU",8);
        *(undefined8 *)((long)handle + 0x635) = 0x6572756c696166;
        *(undefined4 *)((long)handle + 0x6d0) = 1;
        *(undefined8 *)((long)in_FS_OFFSET + -0xa3) = 0x6572756c696166;
        in_FS_OFFSET[-0x16] = 0x61636f6c6c612079;
        in_FS_OFFSET[-0x15] = 0x696166206e6f6974;
        in_FS_OFFSET[-0x18] = 0x2873656e616c5056;
        in_FS_OFFSET[-0x17] = 0x726f6d654d203a29;
        in_FS_OFFSET[-0x1a] = 0x706d6f6365446a74;
        in_FS_OFFSET[-0x19] = 0x55596f5473736572;
        goto LAB_0010d3f6;
      }
      uVar15 = uVar17;
      uVar14 = (ulong)uVar3;
      if ((int)uVar3 < 1) {
        uVar14 = uVar17;
      }
      for (; uVar14 != uVar15; uVar15 = uVar15 + 1) {
        ppJVar11[uVar15] = pJVar18;
        pJVar18 = pJVar18 + iw[uVar22];
      }
    }
  }
  else {
    __ptr = (JSAMPROW)0x0;
  }
  iVar12 = _setjmp((__jmp_buf_tag *)((long)handle + 0x528));
  if (iVar12 == 0) {
    if (((uint)flags >> 8 & 1) != 0) {
      *(undefined4 *)((long)handle + 0x26c) = 0;
    }
    if (((uint)flags >> 0xb & 1) != 0) {
      *(undefined4 *)((long)handle + 0x268) = 1;
    }
    *(undefined4 *)((long)handle + 0x264) = 1;
    jpeg_start_decompress(cinfo);
    for (iVar12 = 0; iVar12 < *(int *)((long)handle + 0x294);
        iVar12 = *(int *)((long)handle + 0x3a8) * *(int *)((long)handle + 0x3a4) + iVar12) {
      uVar8 = *(uint *)((long)handle + 0x240);
      if ((int)uVar8 < 1) {
        uVar8 = 0;
      }
      lVar9 = 3;
      for (lVar19 = 0; (ulong)uVar8 << 2 != lVar19; lVar19 = lVar19 + 4) {
        lVar13 = *(long *)((long)handle + 0x338);
        if (iVar5 == 2) {
          *(int *)(lVar13 + 0x18 + lVar9 * 4) = iVar6;
          iVar21 = *(int *)(lVar13 + lVar9 * 4);
          iVar7 = *(int *)((long)handle + 0x3a4);
          *(int *)(lVar13 + 0x34 + lVar9 * 4) = (((iVar1 << 4) / iVar2) * iVar21) / iVar7;
          *(undefined8 *)(*(long *)((long)handle + 0x460) + 8 + lVar19 * 2) =
               *(undefined8 *)(*(long *)((long)handle + 0x460) + 8);
        }
        else {
          iVar21 = *(int *)(lVar13 + lVar9 * 4);
          iVar7 = *(int *)((long)handle + 0x3a4);
        }
        iVar7 = (iVar21 * iVar12) / iVar7;
        *(int *)((long)crow + lVar19) = iVar7;
        if (bVar4) {
          lVar13 = *(long *)((long)tmpbuf + lVar19 * 2);
        }
        else {
          lVar13 = (long)iVar7 * 8 + *(long *)((long)outbuf + lVar19 * 2);
        }
        *(long *)((long)yuvptr + lVar19 * 2) = lVar13;
        lVar9 = lVar9 + 0x18;
      }
      jpeg_read_raw_data(cinfo,yuvptr,
                         *(int *)((long)handle + 0x3a8) * *(int *)((long)handle + 0x3a4));
      if (bVar4) {
        for (lVar9 = 0; lVar9 < *(int *)((long)handle + 0x240); lVar9 = lVar9 + 1) {
          iVar21 = crow[lVar9];
          uVar8 = ph[lVar9] - iVar21;
          if (th[lVar9] < (int)uVar8) {
            uVar8 = th[lVar9];
          }
          if ((int)uVar8 < 1) {
            uVar8 = 0;
          }
          for (uVar17 = 0; uVar8 != uVar17; uVar17 = uVar17 + 1) {
            memcpy(outbuf[lVar9][(long)iVar21 + uVar17],tmpbuf[lVar9][uVar17],(long)pw[lVar9]);
          }
        }
      }
    }
    jpeg_finish_decompress(cinfo);
    uVar8 = 0;
    goto LAB_0010d31d;
  }
  goto LAB_0010d58c;
}

Assistant:

DLLEXPORT int tjDecompressToYUVPlanes(tjhandle handle,
                                      const unsigned char *jpegBuf,
                                      unsigned long jpegSize,
                                      unsigned char **dstPlanes, int width,
                                      int *strides, int height, int flags)
{
  int i, sfi, row, retval = 0;
  int jpegwidth, jpegheight, jpegSubsamp, scaledw, scaledh;
  int pw[MAX_COMPONENTS], ph[MAX_COMPONENTS], iw[MAX_COMPONENTS],
    tmpbufsize = 0, usetmpbuf = 0, th[MAX_COMPONENTS];
  JSAMPLE *_tmpbuf = NULL, *ptr;
  JSAMPROW *outbuf[MAX_COMPONENTS], *tmpbuf[MAX_COMPONENTS];
  int dctsize;
  struct my_progress_mgr progress;

  GET_DINSTANCE(handle);
  this->jerr.stopOnWarning = (flags & TJFLAG_STOPONWARNING) ? TRUE : FALSE;

  for (i = 0; i < MAX_COMPONENTS; i++) {
    tmpbuf[i] = NULL;  outbuf[i] = NULL;
  }

  if ((this->init & DECOMPRESS) == 0)
    THROW("tjDecompressToYUVPlanes(): Instance has not been initialized for decompression");

  if (jpegBuf == NULL || jpegSize <= 0 || !dstPlanes || !dstPlanes[0] ||
      width < 0 || height < 0)
    THROW("tjDecompressToYUVPlanes(): Invalid argument");

#ifndef NO_PUTENV
  if (flags & TJFLAG_FORCEMMX) putenv("JSIMD_FORCEMMX=1");
  else if (flags & TJFLAG_FORCESSE) putenv("JSIMD_FORCESSE=1");
  else if (flags & TJFLAG_FORCESSE2) putenv("JSIMD_FORCESSE2=1");
#endif

  if (flags & TJFLAG_LIMITSCANS) {
    MEMZERO(&progress, sizeof(struct my_progress_mgr));
    progress.pub.progress_monitor = my_progress_monitor;
    progress.this = this;
    dinfo->progress = &progress.pub;
  } else
    dinfo->progress = NULL;

  if (setjmp(this->jerr.setjmp_buffer)) {
    /* If we get here, the JPEG code has signaled an error. */
    retval = -1;  goto bailout;
  }

  if (!this->headerRead) {
    jpeg_mem_src_tj(dinfo, jpegBuf, jpegSize);
    jpeg_read_header(dinfo, TRUE);
  }
  this->headerRead = 0;
  jpegSubsamp = getSubsamp(dinfo);
  if (jpegSubsamp < 0)
    THROW("tjDecompressToYUVPlanes(): Could not determine subsampling type for JPEG image");

  if (jpegSubsamp != TJSAMP_GRAY && (!dstPlanes[1] || !dstPlanes[2]))
    THROW("tjDecompressToYUVPlanes(): Invalid argument");

  jpegwidth = dinfo->image_width;  jpegheight = dinfo->image_height;
  if (width == 0) width = jpegwidth;
  if (height == 0) height = jpegheight;
  for (i = 0; i < NUMSF; i++) {
    scaledw = TJSCALED(jpegwidth, sf[i]);
    scaledh = TJSCALED(jpegheight, sf[i]);
    if (scaledw <= width && scaledh <= height)
      break;
  }
  if (i >= NUMSF)
    THROW("tjDecompressToYUVPlanes(): Could not scale down to desired image dimensions");
  if (dinfo->num_components > 3)
    THROW("tjDecompressToYUVPlanes(): JPEG image must have 3 or fewer components");

  width = scaledw;  height = scaledh;
  dinfo->scale_num = sf[i].num;
  dinfo->scale_denom = sf[i].denom;
  sfi = i;
  jpeg_calc_output_dimensions(dinfo);

  dctsize = DCTSIZE * sf[sfi].num / sf[sfi].denom;

  for (i = 0; i < dinfo->num_components; i++) {
    jpeg_component_info *compptr = &dinfo->comp_info[i];
    int ih;

    iw[i] = compptr->width_in_blocks * dctsize;
    ih = compptr->height_in_blocks * dctsize;
    pw[i] = tjPlaneWidth(i, dinfo->output_width, jpegSubsamp);
    ph[i] = tjPlaneHeight(i, dinfo->output_height, jpegSubsamp);
    if (iw[i] != pw[i] || ih != ph[i]) usetmpbuf = 1;
    th[i] = compptr->v_samp_factor * dctsize;
    tmpbufsize += iw[i] * th[i];
    if ((outbuf[i] = (JSAMPROW *)malloc(sizeof(JSAMPROW) * ph[i])) == NULL)
      THROW("tjDecompressToYUVPlanes(): Memory allocation failure");
    ptr = dstPlanes[i];
    for (row = 0; row < ph[i]; row++) {
      outbuf[i][row] = ptr;
      ptr += (strides && strides[i] != 0) ? strides[i] : pw[i];
    }
  }
  if (usetmpbuf) {
    if ((_tmpbuf = (JSAMPLE *)malloc(sizeof(JSAMPLE) * tmpbufsize)) == NULL)
      THROW("tjDecompressToYUVPlanes(): Memory allocation failure");
    ptr = _tmpbuf;
    for (i = 0; i < dinfo->num_components; i++) {
      if ((tmpbuf[i] = (JSAMPROW *)malloc(sizeof(JSAMPROW) * th[i])) == NULL)
        THROW("tjDecompressToYUVPlanes(): Memory allocation failure");
      for (row = 0; row < th[i]; row++) {
        tmpbuf[i][row] = ptr;
        ptr += iw[i];
      }
    }
  }

  if (setjmp(this->jerr.setjmp_buffer)) {
    /* If we get here, the JPEG code has signaled an error. */
    retval = -1;  goto bailout;
  }

  if (flags & TJFLAG_FASTUPSAMPLE) dinfo->do_fancy_upsampling = FALSE;
  if (flags & TJFLAG_FASTDCT) dinfo->dct_method = JDCT_FASTEST;
  dinfo->raw_data_out = TRUE;

  jpeg_start_decompress(dinfo);
  for (row = 0; row < (int)dinfo->output_height;
       row += dinfo->max_v_samp_factor * dinfo->_min_DCT_scaled_size) {
    JSAMPARRAY yuvptr[MAX_COMPONENTS];
    int crow[MAX_COMPONENTS];

    for (i = 0; i < dinfo->num_components; i++) {
      jpeg_component_info *compptr = &dinfo->comp_info[i];

      if (jpegSubsamp == TJ_420) {
        /* When 4:2:0 subsampling is used with IDCT scaling, libjpeg will try
           to be clever and use the IDCT to perform upsampling on the U and V
           planes.  For instance, if the output image is to be scaled by 1/2
           relative to the JPEG image, then the scaling factor and upsampling
           effectively cancel each other, so a normal 8x8 IDCT can be used.
           However, this is not desirable when using the decompress-to-YUV
           functionality in TurboJPEG, since we want to output the U and V
           planes in their subsampled form.  Thus, we have to override some
           internal libjpeg parameters to force it to use the "scaled" IDCT
           functions on the U and V planes. */
        compptr->_DCT_scaled_size = dctsize;
        compptr->MCU_sample_width = tjMCUWidth[jpegSubsamp] *
          sf[sfi].num / sf[sfi].denom *
          compptr->v_samp_factor / dinfo->max_v_samp_factor;
        dinfo->idct->inverse_DCT[i] = dinfo->idct->inverse_DCT[0];
      }
      crow[i] = row * compptr->v_samp_factor / dinfo->max_v_samp_factor;
      if (usetmpbuf) yuvptr[i] = tmpbuf[i];
      else yuvptr[i] = &outbuf[i][crow[i]];
    }
    jpeg_read_raw_data(dinfo, yuvptr,
                       dinfo->max_v_samp_factor * dinfo->_min_DCT_scaled_size);
    if (usetmpbuf) {
      int j;

      for (i = 0; i < dinfo->num_components; i++) {
        for (j = 0; j < MIN(th[i], ph[i] - crow[i]); j++) {
          memcpy(outbuf[i][crow[i] + j], tmpbuf[i][j], pw[i]);
        }
      }
    }
  }
  jpeg_finish_decompress(dinfo);

bailout:
  if (dinfo->global_state > DSTATE_START) jpeg_abort_decompress(dinfo);
  for (i = 0; i < MAX_COMPONENTS; i++) {
    free(tmpbuf[i]);
    free(outbuf[i]);
  }
  free(_tmpbuf);
  if (this->jerr.warning) retval = -1;
  this->jerr.stopOnWarning = FALSE;
  return retval;
}